

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtexture.cpp
# Opt level: O2

int __thiscall
FJPEGTexture::CopyTrueColorPixels
          (FJPEGTexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  void *pvVar1;
  anon_union_4_2_12391d7c_for_PalEntry_0 *paVar2;
  undefined8 uVar3;
  undefined4 *puVar4;
  long lVar5;
  undefined8 uVar6;
  JDIMENSION JVar7;
  int iVar8;
  BYTE *ptr;
  FWadLump lump;
  jpeg_decompress_struct cinfo;
  jpeg_error_mgr jerr;
  PalEntry pe [256];
  FLumpSourceMgr sourcemgr;
  
  FWadCollection::OpenLumpNum(&lump,&Wads,(this->super_FTexture).SourceLump);
  cinfo.err = (jpeg_error_mgr *)jpeg_std_error(&jerr);
  (cinfo.err)->output_message = JPEG_OutputMessage;
  (cinfo.err)->error_exit = JPEG_ErrorExit;
  jpeg_CreateDecompress(&cinfo,0x50,0x290);
  cinfo.src = &sourcemgr.super_jpeg_source_mgr;
  sourcemgr.super_jpeg_source_mgr.init_source = FLumpSourceMgr::InitSource;
  sourcemgr.super_jpeg_source_mgr.fill_input_buffer = FLumpSourceMgr::FillInputBuffer;
  sourcemgr.super_jpeg_source_mgr.skip_input_data = FLumpSourceMgr::SkipInputData;
  sourcemgr.super_jpeg_source_mgr.resync_to_restart = jpeg_resync_to_restart;
  sourcemgr.super_jpeg_source_mgr.term_source = FLumpSourceMgr::TermSource;
  sourcemgr.super_jpeg_source_mgr.next_input_byte = (JOCTET *)0x0;
  sourcemgr.super_jpeg_source_mgr.bytes_in_buffer = 0;
  sourcemgr.Lump = &lump.super_FileReader;
  jpeg_read_header(&cinfo,1);
  if (cinfo.num_components != 3 || cinfo.out_color_space != JCS_RGB) {
    if ((cinfo.num_components != 4 || cinfo.out_color_space != JCS_CMYK) &&
       ((cinfo.out_color_space != JCS_GRAYSCALE || (cinfo.num_components != 1)))) {
      Printf("\x1cIUnsupported color format\n");
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0xffffffff;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
  }
  jpeg_start_decompress(&cinfo);
  JVar7 = cinfo.output_height;
  iVar8 = 0;
  pvVar1 = operator_new__((ulong)(cinfo.output_width * cinfo.output_height * cinfo.output_components
                                 ));
  while (cinfo.output_scanline < JVar7) {
    ptr = (BYTE *)((ulong)(cinfo.output_width * iVar8 * cinfo.output_components) + (long)pvVar1);
    jpeg_read_scanlines(&cinfo,&ptr,1);
    iVar8 = iVar8 + 1;
    JVar7 = cinfo.output_height;
  }
  if (cinfo.out_color_space == JCS_CMYK) {
    uVar3 = 4;
    uVar6 = 4;
  }
  else {
    if (cinfo.out_color_space != JCS_RGB) {
      if (cinfo.out_color_space != JCS_GRAYSCALE) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/textures/jpegtexture.cpp"
                      ,0x210,
                      "virtual int FJPEGTexture::CopyTrueColorPixels(FBitmap *, int, int, int, FCopyInfo *)"
                     );
      }
      paVar2 = &pe[0].field_0;
      for (lVar5 = 0; lVar5 != 0x1010100; lVar5 = lVar5 + 0x10101) {
        *paVar2 = (anon_union_4_2_12391d7c_for_PalEntry_0)((uint)lVar5 | 0xff000000);
        paVar2 = paVar2 + 1;
      }
      (*bmp->_vptr_FBitmap[3])
                (bmp,(ulong)(uint)x,(ulong)(uint)y,pvVar1,(ulong)cinfo.output_width,(ulong)JVar7,1,
                 (ulong)cinfo.output_width,(ulong)(uint)rotate,pe,inf);
      goto LAB_005a2bfd;
    }
    uVar6 = 0;
    uVar3 = 3;
  }
  (*bmp->_vptr_FBitmap[2])
            (bmp,(ulong)(uint)x,(ulong)(uint)y,pvVar1,(ulong)cinfo.output_width,(ulong)JVar7,uVar3,
             (ulong)(cinfo.output_components * cinfo.output_width),(ulong)(uint)rotate,uVar6,inf,0,0
             ,0);
LAB_005a2bfd:
  jpeg_finish_decompress(&cinfo);
  jpeg_destroy_decompress(&cinfo);
  if (pvVar1 != (void *)0x0) {
    operator_delete__(pvVar1);
  }
  FWadLump::~FWadLump(&lump);
  return 0;
}

Assistant:

int FJPEGTexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	PalEntry pe[256];

	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	JSAMPLE *buff = NULL;

	jpeg_decompress_struct cinfo;
	jpeg_error_mgr jerr;

	cinfo.err = jpeg_std_error(&jerr);
	cinfo.err->output_message = JPEG_OutputMessage;
	cinfo.err->error_exit = JPEG_ErrorExit;
	jpeg_create_decompress(&cinfo);

	try
	{
		FLumpSourceMgr sourcemgr(&lump, &cinfo);
		jpeg_read_header(&cinfo, TRUE);

		if (!((cinfo.out_color_space == JCS_RGB && cinfo.num_components == 3) ||
			  (cinfo.out_color_space == JCS_CMYK && cinfo.num_components == 4) ||
			  (cinfo.out_color_space == JCS_GRAYSCALE && cinfo.num_components == 1)))
		{
			Printf (TEXTCOLOR_ORANGE "Unsupported color format\n");
			throw -1;
		}
		jpeg_start_decompress(&cinfo);

		int yc = 0;
		buff = new BYTE[cinfo.output_height * cinfo.output_width * cinfo.output_components];


		while (cinfo.output_scanline < cinfo.output_height)
		{
			BYTE * ptr = buff + cinfo.output_width * cinfo.output_components * yc;
			jpeg_read_scanlines(&cinfo, &ptr, 1);
			yc++;
		}

		switch (cinfo.out_color_space)
		{
		case JCS_RGB:
			bmp->CopyPixelDataRGB(x, y, buff, cinfo.output_width, cinfo.output_height, 
				3, cinfo.output_width * cinfo.output_components, rotate, CF_RGB, inf);
			break;

		case JCS_GRAYSCALE:
			for(int i=0;i<256;i++) pe[i]=PalEntry(255,i,i,i);	// default to a gray map
			bmp->CopyPixelData(x, y, buff, cinfo.output_width, cinfo.output_height, 
				1, cinfo.output_width, rotate, pe, inf);
			break;

		case JCS_CMYK:
			bmp->CopyPixelDataRGB(x, y, buff, cinfo.output_width, cinfo.output_height, 
				4, cinfo.output_width * cinfo.output_components, rotate, CF_CMYK, inf);
			break;

		default:
			assert(0);
			break;
		}
		jpeg_finish_decompress(&cinfo);
	}
	catch(int)
	{
		Printf (TEXTCOLOR_ORANGE "   in JPEG texture %s\n", Name.GetChars());
	}
	jpeg_destroy_decompress(&cinfo);
	if (buff != NULL) delete [] buff;
	return 0;
}